

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O3

FADFADSTATE * FADatan(FADFADSTATE *__return_storage_ptr__,FADFADSTATE *x)

{
  Fad<double> *expr;
  uint sz;
  FADFADSTATE *extraout_RAX;
  long lVar1;
  int i;
  long lVar2;
  Fad<double> fadres;
  Fad<double> local_d8;
  Fad<double> *local_b8;
  Fad<double> *local_b0;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>_>
  local_a8;
  Fad<double> local_98;
  undefined1 local_78 [24];
  Fad<double> *local_60;
  Fad<double> local_50;
  
  expr = &x->val_;
  FadFuncAtan<Fad<double>_>::FadFuncAtan((FadFuncAtan<Fad<double>_> *)&local_98,expr);
  FadExpr<FadFuncAtan<Fad<double>_>_>::FadExpr
            ((FadExpr<FadFuncAtan<Fad<double>_>_> *)local_78,(FadFuncAtan<Fad<double>_> *)&local_98)
  ;
  Fad<double>::~Fad(&local_98);
  local_d8.val_ = atan((double)local_78._8_8_);
  lVar2 = (long)(int)local_78._16_4_;
  local_d8.dx_.num_elts = 0;
  local_d8.dx_.ptr_to_data = (double *)0x0;
  if (0 < lVar2) {
    local_d8.dx_.num_elts = local_78._16_4_;
    local_d8.dx_.ptr_to_data = (double *)operator_new__(lVar2 * 8);
    lVar1 = 0;
    do {
      local_d8.dx_.ptr_to_data[lVar1] =
           (&local_60->val_)[lVar1] / ((double)local_78._8_8_ * (double)local_78._8_8_ + 1.0);
      lVar1 = lVar1 + 1;
    } while (lVar2 != lVar1);
  }
  local_d8.defaultVal = 0.0;
  Fad<double>::~Fad((Fad<double> *)(local_78 + 8));
  sz = (x->dx_).num_elts;
  Fad<Fad<double>_>::Fad(__return_storage_ptr__,sz,&local_d8);
  if (0 < (int)sz) {
    lVar2 = 0;
    i = 0;
    do {
      local_98.dx_.num_elts = 0;
      local_98.dx_._4_4_ = 0x3ff00000;
      local_98.dx_.ptr_to_data = (double *)0x0;
      local_98.defaultVal = (double)&local_b8;
      local_78._8_8_ = 1.0;
      local_78._16_8_ = 0.0;
      local_60 = &local_98;
      local_b8 = expr;
      local_b0 = expr;
      Fad<Fad<double>_>::dx(&local_50,x,i);
      local_a8.fadexpr_.left_ =
           (FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
            *)local_78;
      local_a8.fadexpr_.right_ = &local_50;
      Fad<double>::operator=
                ((Fad<double> *)((long)&((__return_storage_ptr__->dx_).ptr_to_data)->val_ + lVar2),
                 &local_a8);
      Fad<double>::~Fad(&local_50);
      i = i + 1;
      lVar2 = lVar2 + 0x20;
    } while ((ulong)sz << 5 != lVar2);
  }
  Fad<double>::~Fad(&local_d8);
  return extraout_RAX;
}

Assistant:

static FADFADSTATE FADatan(FADFADSTATE x)
{
    Fad<STATE> fadres = atan(x.val());
    int sz = x.size();
    FADFADSTATE resa(sz,fadres);
    for (int i=0; i<sz; i++) {
        resa.fastAccessDx(i) = 1./(1.+x.val()*x.val())*x.dx(i);
    }
    return resa;
}